

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O2

base_learner * lrqfa_setup(options_i *options,vw *all)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  base_learner *l;
  single_learner *base;
  learner<LRQFAstate,_example> *plVar4;
  size_type sVar5;
  allocator local_191;
  free_ptr<LRQFAstate> lrq;
  char *local_180 [4];
  string lrqfa;
  string local_140;
  string local_120;
  string lrqopt;
  string local_d0 [64];
  bool local_90;
  option_group_definition new_options;
  
  lrqfa._M_dataplus._M_p = (pointer)&lrqfa.field_2;
  lrqfa._M_string_length = 0;
  lrqfa.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_120,"Low Rank Quadratics FA",(allocator *)&lrqopt);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_140,"lrqfa",(allocator *)&lrq);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&lrqopt,&local_140,&lrqfa);
  local_90 = true;
  std::__cxx11::string::string
            ((string *)local_180,"use low rank quadratic features with field aware weights",
             &local_191);
  std::__cxx11::string::_M_assign(local_d0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&lrqopt);
  std::__cxx11::string::~string((string *)local_180);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&lrqopt);
  std::__cxx11::string::~string((string *)&local_140);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&lrqopt,"lrqfa",(allocator *)local_180);
  iVar3 = (*options->_vptr_options_i[1])(options,&lrqopt);
  std::__cxx11::string::~string((string *)&lrqopt);
  if ((char)iVar3 == '\0') {
    plVar4 = (learner<LRQFAstate,_example> *)0x0;
  }
  else {
    scoped_calloc_or_throw<LRQFAstate>();
    (lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->all = all;
    spoof_hex_encoded_namespaces(&lrqopt,&lrqfa);
    std::__cxx11::string::find_last_not_of((char *)&lrqopt,0x2427aa);
    std::__cxx11::string::substr
              ((ulong)&(lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->field_name,
               (ulong)&lrqopt);
    std::__cxx11::string::substr((ulong)local_180,(ulong)&lrqopt);
    iVar3 = atoi(local_180[0]);
    (lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->k = iVar3;
    std::__cxx11::string::~string((string *)local_180);
    pcVar1 = ((lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->field_name)._M_dataplus.
             _M_p;
    sVar2 = ((lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->field_name)._M_string_length
    ;
    for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
      (lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->field_id[pcVar1[sVar5]] =
           (int)sVar5;
    }
    all->wpp = ((lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->k + 1) * all->wpp;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::init_learner<LRQFAstate,example,LEARNER::learner<char,example>>
                       (&lrq,base,predict_or_learn<true>,predict_or_learn<false>,
                        (long)(lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->k *
                        ((lrq._M_t.super___uniq_ptr_impl<LRQFAstate,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_LRQFAstate_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_LRQFAstate_*,_false>._M_head_impl)->field_name).
                        _M_string_length + 1);
    std::__cxx11::string::~string((string *)&lrqopt);
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::~unique_ptr(&lrq);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&lrqfa);
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* lrqfa_setup(options_i& options, vw& all)
{
  std::string lrqfa;
  option_group_definition new_options("Low Rank Quadratics FA");
  new_options.add(make_option("lrqfa", lrqfa).keep().help("use low rank quadratic features with field aware weights"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrqfa"))
    return nullptr;

  auto lrq = scoped_calloc_or_throw<LRQFAstate>();
  lrq->all = &all;

  string lrqopt = spoof_hex_encoded_namespaces(lrqfa);
  size_t last_index = lrqopt.find_last_not_of("0123456789");
  new (&lrq->field_name) string(lrqopt.substr(0, last_index + 1));  // make sure there is no duplicates
  lrq->k = atoi(lrqopt.substr(last_index + 1).c_str());

  int fd_id = 0;
  for (char i : lrq->field_name) lrq->field_id[(int)i] = fd_id++;

  all.wpp = all.wpp * (uint64_t)(1 + lrq->k);
  learner<LRQFAstate, example>& l = init_learner(lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>,
      predict_or_learn<false>, 1 + lrq->field_name.size() * lrq->k);

  return make_base(l);
}